

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

void usage(char *progname,char *reason)

{
  int iVar1;
  FILE *local_28;
  FILE *out;
  uint i;
  char *reason_local;
  char *progname_local;
  
  if (reason == (char *)0x0) {
    local_28 = _stdout;
  }
  else {
    local_28 = _stderr;
  }
  fprintf(local_28,
          "usage: %s [-ceghnrst] [-Hm] [-F fragment-size] [-l len] [-o offset] archive command1 [args] [command2 [args] ...]\n"
          ,progname);
  if (reason != (char *)0x0) {
    fprintf(local_28,"%s\n",reason);
    exit(1);
  }
  fprintf(local_28,
          "\nSupported options are:\n\t-c\t\tcheck consistency\n\t-e\t\terror if archive already exists (only useful with -n)\n\t-F size\t\tfragment size for in memory archive\n\t-g\t\tguess file name encoding (for stat)\n\t-H\t\twrite files with holes compactly\n\t-h\t\tdisplay this usage\n\t-l len\t\tonly use len bytes of file\n\t-m\t\tread archive into memory, and modify there; write out at end\n\t-n\t\tcreate archive if it doesn\'t exist\n\t-o offset\tstart reading file at offset\n\t-r\t\tprint raw file name encoding without translation (for stat)\n\t-s\t\tfollow file name convention strictly (for stat)\n\t-t\t\tdisregard current archive contents, if any\n"
         );
  fprintf(local_28,"\nSupported commands and arguments are:\n");
  for (out._4_4_ = 0; out._4_4_ < 0x21; out._4_4_ = out._4_4_ + 1) {
    fprintf(local_28,"\t%s %s\n\t    %s\n\n",dispatch_table[out._4_4_].cmdline_name,
            dispatch_table[out._4_4_].arg_names,dispatch_table[out._4_4_].description);
  }
  fprintf(local_28,
          "\nSupported flags are:\n\t0\t(no flags)\n\tC\tZIP_FL_NOCASE\n\tc\tZIP_FL_CENTRAL\n\td\tZIP_FL_NODIR\n\tl\tZIP_FL_LOCAL\n\tu\tZIP_FL_UNCHANGED\n"
         );
  fprintf(local_28,"\nSupported compression methods are:\n\tdefault\n");
  iVar1 = zip_compression_method_supported(0xc,1);
  if (iVar1 != 0) {
    fprintf(local_28,"\tbzip2\n");
  }
  fprintf(local_28,"\tdeflate\n\tstore\n");
  iVar1 = zip_compression_method_supported(0x5f,1);
  if (iVar1 != 0) {
    fprintf(local_28,"\txz\n");
  }
  fprintf(local_28,"\nSupported encryption methods are:\n\tnone\n");
  iVar1 = zip_encryption_method_supported(0x101,1);
  if (iVar1 != 0) {
    fprintf(local_28,"\tAES-128\n");
  }
  iVar1 = zip_encryption_method_supported(0x102,1);
  if (iVar1 != 0) {
    fprintf(local_28,"\tAES-192\n");
  }
  iVar1 = zip_encryption_method_supported(0x103,1);
  if (iVar1 != 0) {
    fprintf(local_28,"\tAES-256\n");
  }
  fprintf(local_28,"\tPKWARE\n");
  fprintf(local_28,"\nThe index is zero-based.\n");
  exit(0);
}

Assistant:

static void
usage(const char *progname, const char *reason) {
    unsigned int i;
    FILE *out;
    if (reason == NULL)
	out = stdout;
    else
	out = stderr;
    fprintf(out, "usage: %s [-ceghnrst]" USAGE_REGRESS " [-l len] [-o offset] archive command1 [args] [command2 [args] ...]\n", progname);
    if (reason != NULL) {
	fprintf(out, "%s\n", reason);
	exit(1);
    }

    fprintf(out, "\nSupported options are:\n"
		 "\t-c\t\tcheck consistency\n"
		 "\t-e\t\terror if archive already exists (only useful with -n)\n"
#ifdef FOR_REGRESS
		 "\t-F size\t\tfragment size for in memory archive\n"
#endif
		 "\t-g\t\tguess file name encoding (for stat)\n"
#ifdef FOR_REGRESS
		 "\t-H\t\twrite files with holes compactly\n"
#endif
		 "\t-h\t\tdisplay this usage\n"
		 "\t-l len\t\tonly use len bytes of file\n"
#ifdef FOR_REGRESS
		 "\t-m\t\tread archive into memory, and modify there; write out at end\n"
#endif
		 "\t-n\t\tcreate archive if it doesn't exist\n"
		 "\t-o offset\tstart reading file at offset\n"
		 "\t-r\t\tprint raw file name encoding without translation (for stat)\n"
		 "\t-s\t\tfollow file name convention strictly (for stat)\n"
		 "\t-t\t\tdisregard current archive contents, if any\n");
    fprintf(out, "\nSupported commands and arguments are:\n");
    for (i = 0; i < sizeof(dispatch_table) / sizeof(dispatch_table_t); i++) {
	fprintf(out, "\t%s %s\n\t    %s\n\n", dispatch_table[i].cmdline_name, dispatch_table[i].arg_names, dispatch_table[i].description);
    }
    fprintf(out, "\nSupported flags are:\n"
	    "\t0\t(no flags)\n"
	    "\tC\tZIP_FL_NOCASE\n"
	    "\tc\tZIP_FL_CENTRAL\n"
	    "\td\tZIP_FL_NODIR\n"
	    "\tl\tZIP_FL_LOCAL\n"
	    "\tu\tZIP_FL_UNCHANGED\n");
    fprintf(out, "\nSupported compression methods are:\n"
	    "\tdefault\n");
    if (zip_compression_method_supported(ZIP_CM_BZIP2, 1)) {
	fprintf(out, "\tbzip2\n");
    }
    fprintf(out, "\tdeflate\n"
	    "\tstore\n");
    if (zip_compression_method_supported(ZIP_CM_XZ, 1)) {
	fprintf(out, "\txz\n");
    }
    fprintf(out, "\nSupported encryption methods are:\n"
	    "\tnone\n");
    if (zip_encryption_method_supported(ZIP_EM_AES_128, 1)) {
	fprintf(out, "\tAES-128\n");
    }
    if (zip_encryption_method_supported(ZIP_EM_AES_192, 1)) {
	fprintf(out, "\tAES-192\n");
    }
    if (zip_encryption_method_supported(ZIP_EM_AES_256, 1)) {
	fprintf(out, "\tAES-256\n");
    }
    fprintf(out, "\tPKWARE\n");
    fprintf(out, "\nThe index is zero-based.\n");
    exit(0);
}